

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_util.h
# Opt level: O2

void google::protobuf::
     STLDeleteElements<std::vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>>
               (vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
                *container)

{
  pointer ppPVar1;
  
  if (container !=
      (vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
       *)0x0) {
    STLDeleteContainerPointers<__gnu_cxx::__normal_iterator<google::protobuf::TextFormat::ParseInfoTree**,std::vector<google::protobuf::TextFormat::ParseInfoTree*,std::allocator<google::protobuf::TextFormat::ParseInfoTree*>>>>
              ((__normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
                )(container->
                 super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
                 )._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<google::protobuf::TextFormat::ParseInfoTree_**,_std::vector<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>_>
                )(container->
                 super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish);
    ppPVar1 = (container->
              super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((container->
        super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppPVar1) {
      (container->
      super__Vector_base<google::protobuf::TextFormat::ParseInfoTree_*,_std::allocator<google::protobuf::TextFormat::ParseInfoTree_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppPVar1;
    }
  }
  return;
}

Assistant:

void STLDeleteElements(T *container) {
  if (!container) return;
  STLDeleteContainerPointers(container->begin(), container->end());
  container->clear();
}